

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyusdz.cc
# Opt level: O0

bool tinyusdz::IsUSDC(uint8_t *addr,size_t length)

{
  char header [9];
  size_t length_local;
  uint8_t *addr_local;
  
  if (length < 0x58) {
    addr_local._7_1_ = false;
  }
  else if (*(long *)addr == 0x434453552d525850) {
    addr_local._7_1_ = true;
  }
  else {
    addr_local._7_1_ = false;
  }
  return addr_local._7_1_;
}

Assistant:

bool IsUSDC(const uint8_t *addr, const size_t length) {
  // must be 88bytes or more
  if (length < 88) {
    return false;
  }
  const char header[8 + 1] = "PXR-USDC";

  if (memcmp(header, addr, 8) == 0) {
    return true;
  }

  return false;
}